

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void skiwi::anon_unknown_23::load_test(void)

{
  ulong uVar1;
  char *pcVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator<char> local_121;
  string local_120 [8];
  string script;
  allocator<char> local_d9;
  string local_d8 [32];
  ulong local_b8;
  uint64_t res;
  allocator<char> local_99;
  string local_98 [32];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_58;
  undefined8 *puStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  skiwi_parameters params;
  
  skiwi::skiwi_parameters::skiwi_parameters((skiwi_parameters *)&uStack_40);
  local_48 = 0;
  local_58 = 0;
  puStack_50 = &std::cout;
  local_78 = uStack_40;
  uStack_70 = _params;
  skiwi::scheme_with_skiwi(0);
  std::allocator<char>::allocator();
  pcVar2 = "(load \"./data/load_test_1.scm\")";
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"(load \"./data/load_test_1.scm\")",&local_99);
  skiwi::skiwi_run((skiwi *)local_98,(string *)pcVar2);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  psVar3 = (string *)0x2e4dca;
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"result",&local_d9);
  uVar1 = skiwi::skiwi_run_raw((skiwi *)local_d8,psVar3);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_b8 = uVar1;
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)(script.field_2._M_local_buf + 8),uVar1,6);
  TestEq<char_const*,std::__cxx11::string>
            ("9",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (script.field_2._M_local_buf + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14ba,"void skiwi::(anonymous namespace)::load_test()");
  std::__cxx11::string::~string((string *)(script.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  pcVar2 = "\n(load (string-append \"./data/\" \"load_test_2.scm\"))\n(add3 5)\n";
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"\n(load (string-append \"./data/\" \"load_test_2.scm\"))\n(add3 5)\n",
             &local_121);
  std::allocator<char>::~allocator(&local_121);
  local_b8 = skiwi::skiwi_run_raw((skiwi *)local_120,(string *)pcVar2);
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_148,local_b8,6);
  TestEq<char_const*,std::__cxx11::string>
            ("8",&local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14c8,"void skiwi::(anonymous namespace)::load_test()");
  this = &local_148;
  std::__cxx11::string::~string((string *)this);
  skiwi::skiwi_quit((skiwi *)this);
  std::__cxx11::string::~string(local_120);
  return;
}

Assistant:

void load_test()
    {
    using namespace skiwi;
    skiwi_parameters params;
    params.trace = nullptr;
    params.stderror = &std::cout;
    params.stdoutput = nullptr;
    scheme_with_skiwi(nullptr, nullptr, params);
#ifdef _WIN32
    skiwi_run("(load \"data\\\\load_test_1.scm\")");
#else
    skiwi_run("(load \"./data/load_test_1.scm\")");
#endif
    uint64_t res = skiwi_run_raw("result");
    TEST_EQ("9", skiwi_raw_to_string(res));

#ifdef _WIN32
    std::string script = R"(
(load (string-append "data\\" "load_test_2.scm"))
(add3 5)
)";
#else
    std::string script = R"(
(load (string-append "./data/" "load_test_2.scm"))
(add3 5)
)";
#endif
    res = skiwi_run_raw(script);
    TEST_EQ("8", skiwi_raw_to_string(res));
    skiwi_quit();
    }